

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O1

void __thiscall LinearScan::AssignTempReg(LinearScan *this,Lifetime *lifetime,RegNum reg)

{
  BitVector *pBVar1;
  Func *pFVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  undefined7 in_register_00000011;
  ulong uVar6;
  BVIndex index;
  
  if (0x1f < (byte)(reg - RegRAX)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0xe5b,"(reg > RegNOREG && reg < RegNumCount)",
                       "reg > RegNOREG && reg < RegNumCount");
    if (!bVar4) goto LAB_0058a2d3;
    *puVar5 = 0;
  }
  index = (BVIndex)CONCAT71(in_register_00000011,reg);
  BVUnitT<unsigned_long>::AssertRange(index);
  uVar6 = 1L << (reg & (RegXMM15|RegXMM14));
  if (((this->activeRegs).word >> ((ulong)reg & 0x3f) & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0xe5c,"(!this->activeRegs.Test(reg))","!this->activeRegs.Test(reg)");
    if (!bVar4) goto LAB_0058a2d3;
    *puVar5 = 0;
  }
  if ((lifetime->field_0x9c & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0xe5d,"(lifetime->isSpilled)","lifetime->isSpilled");
    if (!bVar4) {
LAB_0058a2d3:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  pFVar2 = this->func;
  BVUnitT<unsigned_long>::AssertRange(index);
  pBVar1 = &pFVar2->m_regsUsed;
  pBVar1->word = pBVar1->word | uVar6;
  lifetime->reg = reg;
  BVUnitT<unsigned_long>::AssertRange(index);
  (this->tempRegs).word = (this->tempRegs).word | uVar6;
  this->tempRegLifetimes[reg] = lifetime;
  RecordLoopUse(this,(Lifetime *)0x0,reg);
  return;
}

Assistant:

void
LinearScan::AssignTempReg(Lifetime * lifetime, RegNum reg)
{
    Assert(reg > RegNOREG && reg < RegNumCount);
    Assert(!this->activeRegs.Test(reg));
    Assert(lifetime->isSpilled);
    this->func->m_regsUsed.Set(reg);
    lifetime->reg = reg;
    this->tempRegs.Set(reg);
    __analysis_assume(reg > 0 && reg < RegNumCount);
    this->tempRegLifetimes[reg] = lifetime;

    this->RecordLoopUse(nullptr, reg);
}